

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

int IOget_array_size_dimen(char *str,FMFieldList fields,int dimen,int *control_field)

{
  char cVar1;
  int iVar2;
  FMdata_type FVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  FMFieldList p_Var7;
  char *end;
  char field_name [1024];
  char *local_440;
  char local_438 [1032];
  
  *control_field = -1;
  pcVar4 = strchr(str,0x5b);
  lVar5 = 0;
  if (pcVar4 != (char *)0x0) {
    if (dimen != 0) {
      do {
        pcVar4 = strchr(pcVar4 + 1,0x5b);
        if (pcVar4 == (char *)0x0) goto LAB_00122abf;
        dimen = dimen + -1;
      } while (dimen != 0);
    }
    pcVar4 = pcVar4 + 1;
    lVar5 = strtol(pcVar4,&local_440,0);
    if (pcVar4 == local_440) {
      for (lVar5 = 0; (cVar1 = pcVar4[lVar5], cVar1 != '\0' && (cVar1 != ']')); lVar5 = lVar5 + 1) {
        local_438[lVar5] = cVar1;
      }
      local_438[lVar5] = '\0';
      pcVar4 = fields->field_name;
      if (pcVar4 != (char *)0x0) {
        p_Var7 = fields + 1;
        iVar6 = 0;
        do {
          iVar2 = strcmp(local_438,pcVar4);
          if (iVar2 == 0) {
            FVar3 = FMstr_to_data_type(p_Var7[-1].field_type);
            if (FVar3 == integer_type) {
              *control_field = iVar6;
              goto LAB_00122ab9;
            }
            lVar5 = 0;
            fprintf(_stderr,"Variable length control field \"%s\" not of integer type.\n",local_438)
            ;
            goto LAB_00122abf;
          }
          pcVar4 = p_Var7->field_name;
          p_Var7 = p_Var7 + 1;
          iVar6 = iVar6 + 1;
        } while (pcVar4 != (char *)0x0);
      }
      IOget_array_size_dimen_cold_3();
    }
    else if (*local_440 == ']') {
      if (0 < lVar5) goto LAB_00122abf;
      IOget_array_size_dimen_cold_2();
    }
    else {
      IOget_array_size_dimen_cold_1();
    }
LAB_00122ab9:
    lVar5 = 0xffffffff;
  }
LAB_00122abf:
  return (int)lVar5;
}

Assistant:

extern int
IOget_array_size_dimen(const char *str, FMFieldList fields, int dimen, int *control_field)
{
    char *left_paren, *end;
    long static_size;

    *control_field = -1;
    if ((left_paren = strchr(str, '[')) == NULL) {
	return 0;
    }	
    while (dimen != 0) {
	left_paren = strchr(left_paren + 1, '[');
	if (left_paren == NULL) return 0;
	dimen--;
    }
    static_size = strtol(left_paren + 1, &end, 0);
    if (left_paren + 1 == end) {
	/* dynamic element */
	char field_name[1024];
	int count = 0;
	int i = 0;
	while (((left_paren+1)[count] != ']') &&
	       ((left_paren+1)[count] != 0)) {
	    field_name[count] = (left_paren+1)[count];
	    count++;
	}
	field_name[count] = 0;
	while (fields[i].field_name != NULL) {
	    if (strcmp(field_name, fields[i].field_name) == 0) {
		if (FMstr_to_data_type(fields[i].field_type) ==
		    integer_type) {
		    *control_field = i;
		    return -1;
		} else {
		    fprintf(stderr, "Variable length control field \"%s\" not of integer type.\n", field_name);
		    return 0;
		}
	    }
	    i++;
	}
	fprintf(stderr, "Array dimension \"%s\" in type spec\"%s\" not recognized.\n",
		field_name, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    if (*end != ']') {
	fprintf(stderr, "Malformed array dimension, unexpected character '%c' in type spec \"%s\"\n",
		*end, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    if (static_size <= 0) {
	fprintf(stderr, "Non-positive array dimension %ld in type spec \"%s\"\n",
		static_size, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    return static_size;
}